

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ft_raster_example.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  short sVar1;
  short sVar2;
  Bitmap *pBVar3;
  long lVar4;
  int32_t i;
  uint uVar5;
  SW_FT_Span_ *span;
  pointer pSVar6;
  shared_ptr<TRM::Bitmap> framebuffer;
  SpanHolder holder;
  FTOutline outline;
  SW_FT_Raster_Params params;
  Bitmap *local_148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_140;
  pointer local_138;
  Color local_12c;
  _Vector_base<SW_FT_Span_,_std::allocator<SW_FT_Span_>_> local_128;
  FTOutline local_110;
  SW_FT_Raster_Params local_78;
  
  local_110.ft.n_contours = 800;
  local_110.ft.n_points = 0;
  local_78.source = (void *)CONCAT44(local_78.source._4_4_,600);
  std::make_shared<TRM::Bitmap,int,int>((int *)&local_148,(int *)&local_110);
  pBVar3 = local_148;
  TRM::Color::Color((Color *)&local_110,0xff,0xff,0xff,0xff);
  TRM::Bitmap::ClearWithColor(pBVar3,(Color *)&local_110);
  FTOutline::FTOutline(&local_110);
  FTOutline::move_to(&local_110,10.0,10.0);
  FTOutline::quad_to(&local_110,160.0,10.0,160.0,160.0);
  lVar4 = (long)local_110.ft.n_points;
  local_110.ft.points[lVar4].x = 0x280;
  local_110.ft.points[lVar4].y = 0x280;
  local_110.ft.tags[lVar4] = '\x01';
  if ((short)(local_110.ft.n_points + 1) != 0) {
    local_110.ft.contours[local_110.ft.n_contours] = local_110.ft.n_points;
    local_110.ft.n_contours = local_110.ft.n_contours + 1;
  }
  local_110.ft.n_points = local_110.ft.n_points + 1;
  local_78.user = &local_128;
  local_128._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.flags = 3;
  local_78.gray_spans = ft_raster_generation_cb;
  local_78.bbox_cb = ft_bbox_cb;
  local_78.source = &local_110;
  gray_raster_render((gray_PRaster)0x0,&local_78);
  local_138 = local_128._M_impl.super__Vector_impl_data._M_finish;
  for (pSVar6 = local_128._M_impl.super__Vector_impl_data._M_start; pSVar6 != local_138;
      pSVar6 = pSVar6 + 1) {
    sVar1 = pSVar6->x;
    sVar2 = pSVar6->y;
    for (uVar5 = 0; pBVar3 = local_148, uVar5 < pSVar6->len; uVar5 = uVar5 + 1) {
      TRM::Color::Color(&local_12c,'\0','\0','\0',pSVar6->coverage);
      TRM::Bitmap::BlendPixel(pBVar3,uVar5 + (int)sVar1,(int)sVar2,&local_12c);
    }
  }
  TRM::Bitmap::WriteToPng(local_148,"ft_raster_test.png");
  std::_Vector_base<SW_FT_Span_,_std::allocator<SW_FT_Span_>_>::~_Vector_base(&local_128);
  FTOutline::~FTOutline(&local_110);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_140);
  return 0;
}

Assistant:

int main(int argc, const char** argv) {
  std::shared_ptr<TRM::Bitmap> framebuffer =
      std::make_shared<TRM::Bitmap>(WIDTH, HEIGHT);

  framebuffer->ClearWithColor(TRM::Color(255, 255, 255, 255));

  FTOutline outline;

  outline.move_to(10, 10);
  outline.quad_to(160, 10, 160, 160);
  outline.line_to(10, 10);

  outline.end();

  SpanHolder holder;

  SW_FT_Raster_Params params;
  params.flags = SW_FT_RASTER_FLAG_DIRECT | SW_FT_RASTER_FLAG_AA;
  params.gray_spans = &ft_raster_generation_cb;
  params.bbox_cb = &ft_bbox_cb;
  params.user = &holder;
  params.source = &outline.ft;

  sw_ft_grays_raster.raster_render(nullptr, &params);

  for (auto const& span : holder.spans) {
    int32_t x = span.x;
    int32_t y = span.y;
    for (int32_t i = 0; i < span.len; i++) {
      framebuffer->BlendPixel(x + i, y, TRM::Color(0, 0, 0, span.coverage));
    }
  }

  framebuffer->WriteToPng("ft_raster_test.png");
  return 0;
}